

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O2

void __thiscall RobotDynamics::~RobotDynamics(RobotDynamics *this)

{
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->friction).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->damping).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->m).super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&(this->I).
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 );
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&(this->PC).
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  return;
}

Assistant:

RobotDynamics::~RobotDynamics() {}